

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O0

Result __thiscall
tonk::SessionIncoming::onSiameseSolved(SessionIncoming *this,SiameseOriginalPacket *packet)

{
  char *pcVar1;
  long in_RDX;
  ulong uVar2;
  ErrorResult *in_RDI;
  bool bVar3;
  uint8_t *messageData;
  uint messageBytes;
  uint messageType;
  ReadByteStream frameReader;
  Result *result;
  uint16_t value;
  uint8_t *data;
  Result *in_stack_fffffffffffffe10;
  ErrorType in_stack_fffffffffffffe1c;
  string *in_stack_fffffffffffffe20;
  ErrorResult *desc;
  char *in_stack_fffffffffffffe28;
  ErrorResult *in_stack_fffffffffffffe30;
  ErrorResult *this_00;
  undefined1 local_179 [33];
  uint local_158;
  undefined1 local_151;
  uint8_t *local_150;
  allocator local_131;
  string local_130 [32];
  uint local_110;
  uint local_10c;
  ReadByteStream local_108 [3];
  undefined8 local_d0;
  undefined4 local_c4;
  undefined8 in_stack_ffffffffffffff40;
  uint8_t *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  SessionIncoming *in_stack_ffffffffffffff58;
  
  siamese::ReadByteStream::ReadByteStream
            (local_108,*(uint8_t **)(in_RDX + 8),(ulong)*(uint *)(in_RDX + 4));
  while( true ) {
    if (local_108[0].BufferBytes - local_108[0].BytesRead < 2) {
      if (local_108[0].BufferBytes != local_108[0].BytesRead) {
        this_00 = (ErrorResult *)local_179;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_179 + 1),"Invalid frame",(allocator *)this_00)
        ;
        desc = in_RDI;
        pcVar1 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (this_00,pcVar1,(string *)desc,in_stack_fffffffffffffe1c,
                   (ErrorCodeT)in_stack_fffffffffffffe10);
        desc->Source = pcVar1;
        std::__cxx11::string::~string((string *)(local_179 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_179);
        return (Result)in_RDI;
      }
      Result::Success();
      return (Result)in_RDI;
    }
    uVar2 = (ulong)local_108[0].BytesRead;
    local_108[0].BytesRead = local_108[0].BytesRead + 2;
    local_10c = (uint)*(ushort *)(local_108[0].Data + uVar2);
    local_110 = local_10c & 0x7ff;
    if (local_108[0].BufferBytes - local_108[0].BytesRead < local_110) break;
    local_10c = (uint)(*(ushort *)(local_108[0].Data + uVar2) >> 0xb);
    local_150 = local_108[0].Data + local_108[0].BytesRead;
    local_108[0].BytesRead = local_110 + local_108[0].BytesRead;
    if ((local_10c == 0x1f) || (local_10c == 3)) {
      local_151 = Tonk;
      deliverMessage(in_stack_ffffffffffffff58,(uint)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     in_stack_ffffffffffffff48,(uint)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      bVar3 = in_RDI->Source != (char *)0x0;
      if (bVar3) {
        local_151 = Siamese;
      }
      local_158 = (uint)bVar3;
      if ((local_151 & Siamese) == Tonk) {
        Result::~Result(in_stack_fffffffffffffe10);
      }
      if (local_158 != 0) {
        return (Result)in_RDI;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"Truncated message",&local_131);
  local_c4 = 0;
  local_d0 = 9;
  pcVar1 = (char *)operator_new(0x38);
  ErrorResult::ErrorResult
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe1c,(ErrorCodeT)in_stack_fffffffffffffe10);
  in_RDI->Source = pcVar1;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  return (Result)in_RDI;
}

Assistant:

Result SessionIncoming::onSiameseSolved(const SiameseOriginalPacket& packet)
{
    siamese::ReadByteStream frameReader(packet.Data, packet.DataBytes);

    // Process all messages contained in the datagram:
    while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
    {
        // Read message frame header
        unsigned messageType = frameReader.Read16();
        const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

        if (frameReader.Remaining() < messageBytes)
        {
            TONK_DEBUG_BREAK();
            return Result("SessionIncoming::onSiameseSolved", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
        }

        messageType >>= protocol::kMessageLengthBits;
        const uint8_t* messageData = frameReader.Read(messageBytes);

        // Unordered and unreliable data can be processed after Siamese solves
        // the recovery problem
        if (messageType == protocol::MessageType_Unordered ||
            messageType == protocol::MessageType_Unreliable)
        {
            TONK_VERBOSE_INCOMING_LOG("Deliver onSiameseSolved unordered(", packet.PacketNum, ") message: messageType=", messageType, " messageBytes=", messageBytes);

            const Result result = deliverMessage(messageType, messageData, messageBytes);
            if (result.IsFail()) {
                return result;
            }
        }
    }

    // If the message payload was not completely used:
    if (frameReader.Remaining() > 0)
    {
        TONK_DEBUG_BREAK(); // Invalid data
        return Result("SessionIncoming::onSiameseSolved", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
    }

    return Result::Success();
}